

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<int,duckdb::hugeint_t>
          (BaseAppender *this,Vector *col,int input)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  bool bVar3;
  undefined1 auVar4 [12];
  hugeint_t result;
  hugeint_t local_48;
  string local_38;
  
  bVar3 = TryCast::Operation<int,duckdb::hugeint_t>(input,&local_48,false);
  if (bVar3) {
    pdVar1 = col->data;
    iVar2 = (this->chunk).count;
    *(uint64_t *)(pdVar1 + iVar2 * 0x10) = local_48.lower;
    *(int64_t *)((long)(pdVar1 + iVar2 * 0x10) + 8) = local_48.upper;
    return;
  }
  auVar4 = __cxa_allocate_exception(0x10);
  CastExceptionText<int,duckdb::hugeint_t>(&local_38,(duckdb *)(ulong)(uint)input,auVar4._8_4_);
  InvalidInputException::InvalidInputException(auVar4._0_8_,&local_38);
  __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}